

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_CCtx_setParametersUsingCCtxParams(ZSTD_CCtx *cctx,ZSTD_CCtx_params *params)

{
  if ((cctx->streamStage == zcss_init) && (cctx->cdict == (ZSTD_CDict *)0x0)) {
    switchD_00337d4d::default(&cctx->requestedParams,params,0xd8);
    return 0;
  }
  return 0xffffffffffffffc4;
}

Assistant:

size_t ZSTD_CCtx_setParametersUsingCCtxParams(
        ZSTD_CCtx* cctx, const ZSTD_CCtx_params* params)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParametersUsingCCtxParams");
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "The context is in the wrong stage!");
    RETURN_ERROR_IF(cctx->cdict, stage_wrong,
                    "Can't override parameters with cdict attached (some must "
                    "be inherited from the cdict).");

    cctx->requestedParams = *params;
    return 0;
}